

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImU32 col,ImGuiDir dir,float scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  fVar1 = draw_list->_Data->FontSize;
  if (dir + 1U < 6) {
    fVar3 = fVar1 * 0.4 * scale;
    switch(dir) {
    case 0:
      fVar3 = -fVar3;
    case 1:
      fVar6 = fVar3 * 0.75;
      fVar7 = fVar3 * 0.0;
      fVar4 = fVar3 * -0.75;
      fVar8 = fVar3 * 0.866;
      fVar5 = fVar3 * -0.866;
      fVar3 = fVar4;
      break;
    case 2:
      fVar3 = -fVar3;
    case 3:
      fVar6 = fVar3 * 0.0;
      fVar7 = fVar3 * 0.75;
      fVar4 = fVar3 * 0.866;
      fVar5 = fVar3 * -0.75;
      fVar3 = fVar3 * -0.866;
      fVar8 = fVar5;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xebe,"void ImGui::RenderArrow(ImDrawList *, ImVec2, ImU32, ImGuiDir, float)");
    }
  }
  else {
    fVar4 = 0.0;
    fVar5 = 0.0;
    fVar6 = 0.0;
    fVar7 = 0.0;
    fVar3 = 0.0;
    fVar8 = 0.0;
  }
  fVar1 = fVar1 * 0.5;
  fVar2 = fVar1 + pos.x;
  fVar1 = scale * fVar1 + pos.y;
  local_8.x = fVar6 + fVar2;
  local_8.y = fVar7 + fVar1;
  local_10.y = fVar8 + fVar1;
  local_10.x = fVar3 + fVar2;
  local_18.y = fVar1 + fVar5;
  local_18.x = fVar2 + fVar4;
  ImDrawList::AddTriangleFilled(draw_list,&local_8,&local_10,&local_18,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImU32 col, ImGuiDir dir, float scale)
{
    const float h = draw_list->_Data->FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = pos + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f, +0.750f) * r;
        b = ImVec2(-0.866f, -0.750f) * r;
        c = ImVec2(+0.866f, -0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f, +0.000f) * r;
        b = ImVec2(-0.750f, +0.866f) * r;
        c = ImVec2(-0.750f, -0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }
    draw_list->AddTriangleFilled(center + a, center + b, center + c, col);
}